

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O3

UBool icu_63::UnicodeSet::resemblesPattern(UnicodeString *pattern,int32_t pos)

{
  short sVar1;
  UBool UVar2;
  char16_t *pcVar3;
  uint uVar4;
  
  sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar4 = (pattern->fUnion).fFields.fLength;
  }
  else {
    uVar4 = (int)sVar1 >> 5;
  }
  if ((uint)pos < uVar4 && pos + 1 < (int)uVar4) {
    if (((int)sVar1 & 2U) == 0) {
      pcVar3 = (pattern->fUnion).fFields.fArray;
    }
    else {
      pcVar3 = (char16_t *)((long)&pattern->fUnion + 2);
    }
    if (pcVar3[pos] == L'[') {
      return '\x01';
    }
  }
  UVar2 = resemblesPropertyPattern(pattern,pos);
  return UVar2;
}

Assistant:

UBool UnicodeSet::resemblesPattern(const UnicodeString& pattern, int32_t pos) {
    return ((pos+1) < pattern.length() &&
            pattern.charAt(pos) == (UChar)91/*[*/) ||
        resemblesPropertyPattern(pattern, pos);
}